

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

deUint32 *
vk::BinaryRegistryDetail::BinaryIndexHashImpl_find(BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  pointer puVar1;
  bool bVar2;
  deUint32 dVar3;
  deBool dVar4;
  BinaryIndexHashImplSlot *pBVar5;
  BinaryIndexHashImplSlot *pBVar6;
  long lVar7;
  size_t numBytes;
  pointer ptr;
  long lVar8;
  
  if (0 < hash->numElements) {
    puVar1 = (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    numBytes = (long)(key->m_binary).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1;
    ptr = (pointer)0x0;
    if (numBytes != 0) {
      ptr = puVar1;
    }
    dVar3 = deMemoryHash(ptr,numBytes);
    pBVar6 = hash->slotTable[(int)(hash->slotTableSize - 1U & dVar3)];
    do {
      pBVar5 = pBVar6;
      if (pBVar5 == (BinaryIndexHashImplSlot *)0x0) break;
      bVar2 = 0 < pBVar5->numUsed;
      if (pBVar5->numUsed < 1) {
LAB_00a2fe4e:
        pBVar6 = pBVar5->nextSlot;
      }
      else {
        dVar4 = anon_unknown_8::binaryEqual(pBVar5->keys[0],key);
        if (dVar4 == 0) {
          lVar7 = 0;
          do {
            lVar8 = lVar7 + 1;
            bVar2 = lVar8 < pBVar5->numUsed;
            if (pBVar5->numUsed <= lVar8) goto LAB_00a2fe4e;
            dVar4 = anon_unknown_8::binaryEqual(pBVar5->keys[lVar7 + 1],key);
            lVar7 = lVar8;
          } while (dVar4 == 0);
        }
        else {
          lVar8 = 0;
        }
        hash = (BinaryIndexHashImpl *)(pBVar5->values + lVar8);
        pBVar6 = pBVar5;
      }
    } while (!bVar2);
    if (pBVar5 != (BinaryIndexHashImplSlot *)0x0) {
      return (deUint32 *)hash;
    }
  }
  return (deUint32 *)0x0;
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}